

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

QMimeData * __thiscall
QAbstractProxyModel::mimeData(QAbstractProxyModel *this,QModelIndexList *indexes)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QModelIndex *pQVar3;
  arrow_operator_result ppQVar4;
  undefined4 extraout_var;
  QList<QModelIndex> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  QAbstractProxyModelPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList list;
  rvalue_ref in_stack_ffffffffffffff38;
  QList<QModelIndex> *in_stack_ffffffffffffff40;
  QList<QModelIndex> *this_00;
  qsizetype in_stack_ffffffffffffffa8;
  const_iterator local_30;
  QList<QModelIndex> local_28;
  long local_8;
  QMimeData *pQVar5;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAbstractProxyModel *)0x853b55);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x853b8d);
  QList<QModelIndex>::size(in_RSI);
  QList<QModelIndex>::reserve(this_00,in_stack_ffffffffffffffa8);
  local_30.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QModelIndex>::begin(in_stack_ffffffffffffff40);
  o = QList<QModelIndex>::end(in_stack_ffffffffffffff40);
  while( true ) {
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_30,o);
    if (!bVar1) break;
    pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_30);
    (**(code **)(*in_RDI + 400))(&stack0xffffffffffffffa8,in_RDI,pQVar3);
    QList<QModelIndex>::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QList<QModelIndex>::const_iterator::operator++(&local_30);
  }
  ppQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                          *)in_stack_ffffffffffffff40);
  iVar2 = (*((*ppQVar4)->super_QObject)._vptr_QObject[0x1a])(*ppQVar4,&local_28);
  pQVar5 = (QMimeData *)CONCAT44(extraout_var,iVar2);
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x853d16);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData* QAbstractProxyModel::mimeData(const QModelIndexList &indexes) const
{
    Q_D(const QAbstractProxyModel);
    QModelIndexList list;
    list.reserve(indexes.size());
    for (const QModelIndex &index : indexes)
        list << mapToSource(index);
    return d->model->mimeData(list);
}